

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O2

int __thiscall FShaderManager::Find(FShaderManager *this,char *shn)

{
  undefined8 in_RAX;
  uint i;
  ulong uVar1;
  FName sfn;
  
  sfn.Index = (int)((ulong)in_RAX >> 0x20);
  FName::FName(&sfn,shn);
  uVar1 = 0;
  while( true ) {
    if ((this->mTextureEffects).Count <= uVar1) {
      return -1;
    }
    if (((this->mTextureEffects).Array[uVar1]->mName).Index == sfn.Index) break;
    uVar1 = uVar1 + 1;
  }
  return (int)uVar1;
}

Assistant:

int FShaderManager::Find(const char * shn)
{
	FName sfn = shn;

	for(unsigned int i=0;i<mTextureEffects.Size();i++)
	{
		if (mTextureEffects[i]->mName == sfn)
		{
			return i;
		}
	}
	return -1;
}